

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::listRecordings
          (ArchiveProxy *this,int64_t fromRecordingId,int32_t recordCount,int64_t correlationId,
          int64_t controlSessionId)

{
  bool bVar1;
  ListRecordingsRequest *pLVar2;
  uint64_t uVar3;
  undefined1 local_68 [8];
  ListRecordingsRequest msg;
  int64_t controlSessionId_local;
  int64_t correlationId_local;
  int32_t recordCount_local;
  int64_t fromRecordingId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = controlSessionId;
  io::aeron::archive::codecs::ListRecordingsRequest::ListRecordingsRequest
            ((ListRecordingsRequest *)local_68);
  pLVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::ListRecordingsRequest>
                     (this,(ListRecordingsRequest *)local_68);
  pLVar2 = io::aeron::archive::codecs::ListRecordingsRequest::controlSessionId
                     (pLVar2,msg.m_actingVersion);
  pLVar2 = io::aeron::archive::codecs::ListRecordingsRequest::correlationId(pLVar2,correlationId);
  pLVar2 = io::aeron::archive::codecs::ListRecordingsRequest::fromRecordingId
                     (pLVar2,fromRecordingId);
  io::aeron::archive::codecs::ListRecordingsRequest::recordCount(pLVar2,recordCount);
  uVar3 = io::aeron::archive::codecs::ListRecordingsRequest::encodedLength
                    ((ListRecordingsRequest *)local_68);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::listRecordings(std::int64_t fromRecordingId, std::int32_t recordCount, std::int64_t correlationId,
                                  std::int64_t controlSessionId) {
    codecs::ListRecordingsRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .fromRecordingId(fromRecordingId)
        .recordCount(recordCount);

    return offer(msg.encodedLength());
}